

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCallback.cpp
# Opt level: O2

void __thiscall HighsCallback::clear(HighsCallback *this)

{
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(&this->user_callback,(nullptr_t)0x0);
  this->user_callback_data = (void *)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&this->active,10,false);
  clearHighsCallbackDataOut(this);
  (this->data_in).user_interrupt = 0;
  (this->data_in).user_solution = (double *)0x0;
  return;
}

Assistant:

void HighsCallback::clear() {
  this->user_callback = nullptr;
  this->user_callback_data = nullptr;
  this->active.assign(kNumCallbackType, false);
  this->clearHighsCallbackDataOut();
  this->clearHighsCallbackDataIn();
}